

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

void __thiscall
NNTreeIterator::split(NNTreeIterator *this,QPDFObjectHandle *to_split,iterator parent)

{
  QPDFObjectHandle *pQVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  logic_error *plVar5;
  string *psVar6;
  string *psVar7;
  pointer pPVar8;
  int local_31c;
  int local_2b4;
  int local_29c;
  QPDFObjectHandle local_268;
  NNTreeIterator *local_258;
  QPDFObjectHandle local_250;
  undefined1 local_240 [8];
  QPDFObjectHandle next_1;
  _List_iterator<NNTreeIterator::PathElement> _Stack_228;
  int old_idx;
  iterator cur_elem;
  string local_218 [32];
  undefined1 local_1f8 [8];
  QPDFObjectHandle parent_kids;
  QPDFObjectHandle local_1e0;
  QPDFObjectHandle local_1d0;
  undefined1 local_1c0 [8];
  QPDFObjectHandle second_node;
  QPDFObjectHandle local_1a8;
  QPDFObjectHandle local_198;
  uint local_184;
  undefined1 local_180 [4];
  int start_idx;
  QPDFObjectHandle second_half;
  int local_164;
  _List_iterator<NNTreeIterator::PathElement> local_160;
  iterator next;
  string local_150;
  allocator<char> local_129;
  string local_128;
  undefined1 local_108 [8];
  QPDFObjectHandle new_kids;
  undefined1 local_e8 [8];
  QPDFObjectHandle first_node;
  iterator iStack_d0;
  bool is_leaf;
  byte local_c1;
  undefined4 local_c0;
  int iStack_bc;
  bool is_root;
  undefined1 local_b8 [4];
  int threshold;
  string key;
  undefined1 local_90 [4];
  int n;
  QPDFObjectHandle first_half;
  undefined1 local_78 [4];
  int nitems;
  QPDFObjectHandle items;
  int nkids;
  undefined1 local_40 [8];
  QPDFObjectHandle kids;
  QPDFObjectHandle *to_split_local;
  NNTreeIterator *this_local;
  iterator parent_local;
  
  this_local = (NNTreeIterator *)parent._M_node;
  bVar3 = valid(this);
  if (!bVar3) {
    plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar5,"NNTreeIterator::split called an invalid iterator");
    __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nkids,"/Kids",
             (allocator<char> *)
             ((long)&items.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_40,(string *)to_split);
  std::__cxx11::string::~string((string *)&nkids);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&items.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  bVar3 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_40);
  if (bVar3) {
    local_29c = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_40);
  }
  else {
    local_29c = 0;
  }
  items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_4_ = local_29c;
  (*(code *)**(undefined8 **)this->impl->details)();
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_78,(string *)to_split);
  bVar3 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_78);
  if (bVar3) {
    local_2b4 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_78);
  }
  else {
    local_2b4 = 0;
  }
  first_half.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = local_2b4;
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_90);
  key.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_b8);
  iStack_bc = 0;
  if ((int)items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi < 1) {
    if (first_half.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ < 1) {
      plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar5,"NNTreeIterator::split called on invalid node");
      __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    QTC::TC("qpdf","NNTree split items",0);
    QPDFObjectHandle::operator=((QPDFObjectHandle *)local_90,(QPDFObjectHandle *)local_78);
    key.field_2._12_4_ =
         first_half.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._4_4_;
    iStack_bc = this->impl->split_threshold * 2;
    psVar6 = (string *)(*(code *)**(undefined8 **)this->impl->details)();
    std::__cxx11::string::operator=((string *)local_b8,psVar6);
  }
  else {
    QTC::TC("qpdf","NNTree split kids",0);
    QPDFObjectHandle::operator=((QPDFObjectHandle *)local_90,(QPDFObjectHandle *)local_40);
    key.field_2._12_4_ =
         (int)items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    iStack_bc = this->impl->split_threshold;
    std::__cxx11::string::operator=((string *)local_b8,"/Kids");
  }
  if (iStack_bc < (int)key.field_2._12_4_) {
    iStack_d0 = std::__cxx11::
                list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::end
                          (&this->path);
    local_c1 = std::operator==((_Self *)&this_local,&stack0xffffffffffffff30);
    first_node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._7_1_ =
         0 < first_half.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
    if ((bool)local_c1) {
      pQVar1 = (QPDFObjectHandle *)this->impl->qpdf;
      QPDFObjectHandle::newDictionary();
      QPDF::makeIndirectObject((QPDF *)local_e8,pQVar1);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &new_kids.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFObjectHandle::replaceKey
                ((QPDFObjectHandle *)local_e8,(string *)local_b8,(QPDFObjectHandle *)local_90);
      QPDFObjectHandle::newArray();
      QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_108,(QPDFObjectHandle *)local_e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"/Limits",&local_129);
      QPDFObjectHandle::removeKey(to_split,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator(&local_129);
      psVar7 = (string *)(*(code *)**(undefined8 **)this->impl->details)();
      QPDFObjectHandle::removeKey(to_split,psVar7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"/Kids",(allocator<char> *)((long)&next._M_node + 7));
      QPDFObjectHandle::replaceKey(to_split,&local_150,(QPDFObjectHandle *)local_108);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator((allocator<char> *)((long)&next._M_node + 7));
      if ((first_node.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ & 1)
          == 0) {
        QTC::TC("qpdf","NNTree split root + !leaf",0);
        local_160._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::begin
                       (&this->path);
        pPVar8 = std::_List_iterator<NNTreeIterator::PathElement>::operator->(&local_160);
        QPDFObjectHandle::operator=(&pPVar8->node,(QPDFObjectHandle *)local_e8);
      }
      else {
        QTC::TC("qpdf","NNTree split root + leaf",0);
        QPDFObjectHandle::operator=(&this->node,(QPDFObjectHandle *)local_e8);
      }
      local_164 = 0;
      std::__cxx11::list<NNTreeIterator::PathElement,std::allocator<NNTreeIterator::PathElement>>::
      emplace_front<QPDFObjectHandle&,int>
                ((list<NNTreeIterator::PathElement,std::allocator<NNTreeIterator::PathElement>> *)
                 &this->path,to_split,&local_164);
      second_half.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::__cxx11::
           list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::begin
                     (&this->path);
      this_local = (NNTreeIterator *)
                   second_half.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      QPDFObjectHandle::operator=(to_split,(QPDFObjectHandle *)local_e8);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_108);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_e8);
    }
    QPDFObjectHandle::newArray();
    local_184 = (int)key.field_2._12_4_ / 2 & 0xfffffffe;
    while (iVar4 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_90),
          (int)local_184 < iVar4) {
      QPDFObjectHandle::getArrayItem(&local_198,(int)local_90);
      QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_180,&local_198);
      QPDFObjectHandle::~QPDFObjectHandle(&local_198);
      QPDFObjectHandle::eraseItem((QPDFObjectHandle *)local_90,local_184);
    }
    QPDFObjectHandle::QPDFObjectHandle(&local_1a8,to_split);
    second_node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_local;
    resetLimits(this,&local_1a8,(iterator)this_local);
    QPDFObjectHandle::~QPDFObjectHandle(&local_1a8);
    pQVar1 = (QPDFObjectHandle *)this->impl->qpdf;
    QPDFObjectHandle::newDictionary();
    QPDF::makeIndirectObject((QPDF *)local_1c0,pQVar1);
    QPDFObjectHandle::~QPDFObjectHandle(&local_1d0);
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)local_1c0,(string *)local_b8,(QPDFObjectHandle *)local_180);
    QPDFObjectHandle::QPDFObjectHandle(&local_1e0,(QPDFObjectHandle *)local_1c0);
    parent_kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_local;
    resetLimits(this,&local_1e0,(iterator)this_local);
    QPDFObjectHandle::~QPDFObjectHandle(&local_1e0);
    psVar7 = (string *)
             std::_List_iterator<NNTreeIterator::PathElement>::operator->
                       ((_List_iterator<NNTreeIterator::PathElement> *)&this_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_218,"/Kids",(allocator<char> *)((long)&cur_elem._M_node + 7));
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1f8,psVar7);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cur_elem._M_node + 7));
    pPVar8 = std::_List_iterator<NNTreeIterator::PathElement>::operator->
                       ((_List_iterator<NNTreeIterator::PathElement> *)&this_local);
    QPDFObjectHandle::insertItem
              ((QPDFObjectHandle *)local_1f8,pPVar8->kid_number + 1,(QPDFObjectHandle *)local_1c0);
    _Stack_228._M_node = (_List_node_base *)this_local;
    std::_List_iterator<NNTreeIterator::PathElement>::operator++(&stack0xfffffffffffffdd8);
    if ((first_node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._7_1_ & 1) == 0) {
      pPVar8 = std::_List_iterator<NNTreeIterator::PathElement>::operator->
                         (&stack0xfffffffffffffdd8);
      local_31c = pPVar8->kid_number;
    }
    else {
      local_31c = this->item_number;
    }
    next_1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = local_31c;
    if ((int)local_184 <= local_31c) {
      pPVar8 = std::_List_iterator<NNTreeIterator::PathElement>::operator->
                         ((_List_iterator<NNTreeIterator::PathElement> *)&this_local);
      pPVar8->kid_number = pPVar8->kid_number + 1;
      if ((first_node.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ & 1)
          == 0) {
        QTC::TC("qpdf","NNTree split second half kid",0);
        pPVar8 = std::_List_iterator<NNTreeIterator::PathElement>::operator->
                           (&stack0xfffffffffffffdd8);
        QPDFObjectHandle::operator=(&pPVar8->node,(QPDFObjectHandle *)local_1c0);
        uVar2 = local_184;
        pPVar8 = std::_List_iterator<NNTreeIterator::PathElement>::operator->
                           (&stack0xfffffffffffffdd8);
        pPVar8->kid_number = pPVar8->kid_number - uVar2;
      }
      else {
        QTC::TC("qpdf","NNTree split second half item",0);
        setItemNumber(this,(QPDFObjectHandle *)local_1c0,this->item_number - local_184);
      }
    }
    if ((local_c1 & 1) == 0) {
      QTC::TC("qpdf","NNTree split parent",0);
      pPVar8 = std::_List_iterator<NNTreeIterator::PathElement>::operator->
                         ((_List_iterator<NNTreeIterator::PathElement> *)&this_local);
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_240,&pPVar8->node);
      QPDFObjectHandle::QPDFObjectHandle(&local_250,(QPDFObjectHandle *)local_240);
      local_258 = this_local;
      resetLimits(this,&local_250,(iterator)this_local);
      QPDFObjectHandle::~QPDFObjectHandle(&local_250);
      std::_List_iterator<NNTreeIterator::PathElement>::operator--
                ((_List_iterator<NNTreeIterator::PathElement> *)&this_local);
      QPDFObjectHandle::QPDFObjectHandle(&local_268,(QPDFObjectHandle *)local_240);
      split(this,&local_268,(iterator)this_local);
      QPDFObjectHandle::~QPDFObjectHandle(&local_268);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_240);
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1f8);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1c0);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_180);
    local_c0 = 0;
  }
  else {
    local_c0 = 1;
  }
  std::__cxx11::string::~string((string *)local_b8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_90);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_78);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_40);
  return;
}

Assistant:

void
NNTreeIterator::split(QPDFObjectHandle to_split, std::list<PathElement>::iterator parent)
{
    // Split some node along the path to the item pointed to by this iterator, and adjust the
    // iterator so it points to the same item.

    // In examples, for simplicity, /Nums is shown to just contain numbers instead of pairs. Imagine
    // this tree:
    //
    // root: << /Kids [ A B C D ] >>
    // A: << /Nums [ 1 2 3 4 ] >>
    // B: << /Nums [ 5 6 7 8 ] >>
    // C: << /Nums [ 9 10 11 12 ] >>
    // D: << /Kids [ E F ]
    // E: << /Nums [ 13 14 15 16 ] >>
    // F: << /Nums [ 17 18 19 20 ] >>

    // iter1 (points to 19)
    //   path:
    //   - { node: root: kid_number: 3 }
    //   - { node: D, kid_number: 1 }
    //   node: F
    //   item_number: 2

    // iter2 (points to 1)
    //   path:
    //   - { node: root, kid_number: 0}
    //   node: A
    //   item_number: 0

    if (!valid()) {
        throw std::logic_error("NNTreeIterator::split called an invalid iterator");
    }

    // Find the array we actually need to split, which is either this node's kids or items.
    auto kids = to_split.getKey("/Kids");
    int nkids = kids.isArray() ? kids.getArrayNItems() : 0;
    auto items = to_split.getKey(impl.details.itemsKey());
    int nitems = items.isArray() ? items.getArrayNItems() : 0;

    QPDFObjectHandle first_half;
    int n = 0;
    std::string key;
    int threshold = 0;
    if (nkids > 0) {
        QTC::TC("qpdf", "NNTree split kids");
        first_half = kids;
        n = nkids;
        threshold = impl.split_threshold;
        key = "/Kids";
    } else if (nitems > 0) {
        QTC::TC("qpdf", "NNTree split items");
        first_half = items;
        n = nitems;
        threshold = 2 * impl.split_threshold;
        key = impl.details.itemsKey();
    } else {
        throw std::logic_error("NNTreeIterator::split called on invalid node");
    }

    if (n <= threshold) {
        return;
    }

    bool is_root = (parent == this->path.end());
    bool is_leaf = (nitems > 0);

    // CURRENT STATE: tree is in original state; iterator is valid and unchanged.

    if (is_root) {
        // What we want to do is to create a new node for the second half of the items and put it in
        // the parent's /Kids array right after the element that points to the current to_split
        // node, but if we're splitting root, there is no parent, so handle that first.

        // In the non-root case, parent points to the path element whose /Kids contains the first
        // half node, and the first half node is to_split. If we are splitting the root, we need to
        // push everything down a level, but we want to keep the actual root object the same so that
        // indirect references to it remain intact (and also in case it might be a direct object,
        // which it shouldn't be but that case probably exists in the wild). To achieve this, we
        // create a new node for the first half and then replace /Kids in the root to contain it.
        // Then we adjust the path so that the first element is root and the second element, if any,
        // is the new first half. In this way, we make the root case identical to the non-root case
        // so remaining logic can handle them in the same way.

        auto first_node = impl.qpdf.makeIndirectObject(QPDFObjectHandle::newDictionary());
        first_node.replaceKey(key, first_half);
        QPDFObjectHandle new_kids = QPDFObjectHandle::newArray();
        new_kids.appendItem(first_node);
        to_split.removeKey("/Limits"); // already shouldn't be there for root
        to_split.removeKey(impl.details.itemsKey());
        to_split.replaceKey("/Kids", new_kids);
        if (is_leaf) {
            QTC::TC("qpdf", "NNTree split root + leaf");
            this->node = first_node;
        } else {
            QTC::TC("qpdf", "NNTree split root + !leaf");
            auto next = this->path.begin();
            next->node = first_node;
        }
        this->path.emplace_front(to_split, 0);
        parent = this->path.begin();
        to_split = first_node;
    }

    // CURRENT STATE: parent is guaranteed to be defined, and we have the invariants that
    // parent[/Kids][kid_number] == to_split and (++parent).node == to_split.

    // Create a second half array, and transfer the second half of the items into the second half
    // array.
    QPDFObjectHandle second_half = QPDFObjectHandle::newArray();
    int start_idx = ((n / 2) & ~1);
    while (first_half.getArrayNItems() > start_idx) {
        second_half.appendItem(first_half.getArrayItem(start_idx));
        first_half.eraseItem(start_idx);
    }
    resetLimits(to_split, parent);

    // Create a new node to contain the second half
    QPDFObjectHandle second_node = impl.qpdf.makeIndirectObject(QPDFObjectHandle::newDictionary());
    second_node.replaceKey(key, second_half);
    resetLimits(second_node, parent);

    // CURRENT STATE: half the items from the kids or items array in the node being split have been
    // moved into a new node. The new node is not yet attached to the tree. The iterator may have a
    // path element or leaf node that is out of bounds.

    // We need to adjust the parent to add the second node to /Kids and, if needed, update
    // kid_number to traverse through it. We need to update to_split's path element, or the node if
    // this is a leaf, so that the kid/item number points to the right place.

    auto parent_kids = parent->node.getKey("/Kids");
    parent_kids.insertItem(parent->kid_number + 1, second_node);
    auto cur_elem = parent;
    ++cur_elem; // points to end() for leaf nodes
    int old_idx = (is_leaf ? this->item_number : cur_elem->kid_number);
    if (old_idx >= start_idx) {
        ++parent->kid_number;
        if (is_leaf) {
            QTC::TC("qpdf", "NNTree split second half item");
            setItemNumber(second_node, this->item_number - start_idx);
        } else {
            QTC::TC("qpdf", "NNTree split second half kid");
            cur_elem->node = second_node;
            cur_elem->kid_number -= start_idx;
        }
    }
    if (!is_root) {
        QTC::TC("qpdf", "NNTree split parent");
        auto next = parent->node;
        resetLimits(next, parent);
        --parent;
        split(next, parent);
    }
}